

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O3

int __thiscall
Fl_Text_Buffer::findchar_forward(Fl_Text_Buffer *this,int startPos,uint searchChar,int *foundPos)

{
  uint uVar1;
  int iVar2;
  int pos;
  
  pos = this->mLength;
  if (pos < 1 || pos <= startPos) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    if (0 < startPos) {
      iVar2 = startPos;
    }
    do {
      pos = iVar2;
      uVar1 = char_at(this,pos);
      if (uVar1 == searchChar) {
        iVar2 = 1;
        goto LAB_001cfe50;
      }
      iVar2 = next_char(this,pos);
      pos = this->mLength;
    } while (iVar2 < pos);
    iVar2 = 0;
  }
LAB_001cfe50:
  *foundPos = pos;
  return iVar2;
}

Assistant:

int Fl_Text_Buffer::findchar_forward(int startPos, unsigned searchChar,
				     int *foundPos) const 
{
  if (startPos >= mLength) {
    *foundPos = mLength;
    return 0;
  }
  
  if (startPos<0)
    startPos = 0;
  
  for ( ; startPos<mLength; startPos = next_char(startPos)) {
    if (searchChar == char_at(startPos)) {
      *foundPos = startPos;
      return 1;
    }
  }
  
  *foundPos = mLength;
  return 0;
}